

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::AndroidEnergyConsumer::operator==
          (AndroidEnergyConsumer *this,AndroidEnergyConsumer *other)

{
  __type_conflict4 _Var1;
  __type_conflict4 local_19;
  AndroidEnergyConsumer *other_local;
  AndroidEnergyConsumer *this_local;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  local_19 = false;
  if (((_Var1) && (local_19 = false, this->energy_consumer_id_ == other->energy_consumer_id_)) &&
     (local_19 = false, this->ordinal_ == other->ordinal_)) {
    _Var1 = ::std::operator==(&this->type_,&other->type_);
    local_19 = false;
    if (_Var1) {
      local_19 = ::std::operator==(&this->name_,&other->name_);
    }
  }
  return local_19;
}

Assistant:

bool AndroidEnergyConsumer::operator==(const AndroidEnergyConsumer& other) const {
  return unknown_fields_ == other.unknown_fields_
   && energy_consumer_id_ == other.energy_consumer_id_
   && ordinal_ == other.ordinal_
   && type_ == other.type_
   && name_ == other.name_;
}